

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::ClipControlFaceCulling::iterate(ClipControlFaceCulling *this)

{
  TestLog *log;
  RenderContext *renderCtx;
  TestContext *this_00;
  int iVar1;
  deUint32 err;
  qpTestResult qVar2;
  undefined4 extraout_var;
  ShaderProgram *this_01;
  char *description;
  TestError *this_02;
  long lVar4;
  qpTestResult result;
  undefined8 *puVar5;
  float *pfVar6;
  byte bVar7;
  allocator<char> local_16a;
  allocator<char> local_169;
  SharedPtr<glu::ShaderProgram> program;
  string local_158;
  string local_138;
  ClipControlApi cc;
  float vertex_data0 [24];
  long lVar3;
  
  bVar7 = 0;
  log = ((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
         super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar1 = (*((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
            m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  ClipControlApi::ClipControlApi
            (&cc,(this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
                 m_context,(this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.m_api);
  (**(code **)(lVar3 + 0x5e0))(0xb44);
  this_01 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
              m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,
             "#version 400\nin vec3 Position;\nvoid main() {\n    gl_Position = vec4(Position, 1.0);\n}"
             ,&local_169);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,
             "#version 400\nout vec4 FragColor;\nvoid main() {\n    FragColor = vec4(0.0, 1.0, 0.0, 1.0);\n}"
             ,&local_16a);
  glu::makeVtxFragSources((ProgramSources *)vertex_data0,&local_138,&local_158);
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,(ProgramSources *)vertex_data0);
  de::SharedPtr<glu::ShaderProgram>::SharedPtr(&program,this_01);
  glu::ProgramSources::~ProgramSources((ProgramSources *)vertex_data0);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  glu::operator<<(log,program.m_ptr);
  if (((program.m_ptr)->m_program).m_info.linkOk != false) {
    (**(code **)(lVar3 + 0x708))(1,&this->m_vao);
    (**(code **)(lVar3 + 0xd8))(this->m_vao);
    (**(code **)(lVar3 + 0x6c8))(1,&this->m_vbo);
    puVar5 = &DAT_016fca90;
    pfVar6 = vertex_data0;
    for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(undefined8 *)pfVar6 = *puVar5;
      puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      pfVar6 = pfVar6 + (ulong)bVar7 * -4 + 2;
    }
    (**(code **)(lVar3 + 0x40))(0x8892,this->m_vbo);
    (**(code **)(lVar3 + 0x150))(0x8892,0x60,vertex_data0,0x88e4);
    (**(code **)(lVar3 + 0x19f0))(0,2,0x1406,0,0,0);
    (**(code **)(lVar3 + 0x610))(0);
    (**(code **)(lVar3 + 0x1680))(((program.m_ptr)->m_program).m_program);
    result = QP_TEST_RESULT_PASS;
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 4) {
      (**(code **)(lVar3 + 0x1c0))(0x3f800000,0,0,0x3f800000);
      (**(code **)(lVar3 + 0x188))(0x4000);
      (**(code **)(lVar3 + 0x538))(4,0,0xc);
      (*cc.clipControl)(*(GLenum *)((long)&DAT_016fc418 + lVar4),0x935e);
      err = (**(code **)(lVar3 + 0x800))();
      glu::checkError(err,"ClipControl()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cClipControlTests.cpp"
                      ,0x416);
      qVar2 = ValidateFramebuffer(this,(this->super_ClipControlRenderBaseTest).
                                       super_ClipControlBaseTest.super_TestCase.m_context);
      if (qVar2 != QP_TEST_RESULT_PASS) {
        result = qVar2;
      }
    }
    this_00 = (this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
              super_TestCase.super_TestNode.m_testCtx;
    description = qpGetTestResultName(result);
    tcu::TestContext::setTestResult(this_00,result,description);
    de::SharedPtr<glu::ShaderProgram>::~SharedPtr(&program);
    return STOP;
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cClipControlTests.cpp"
             ,0x3f1);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate()
	{

		tcu::TestLog&		  log = m_testCtx.getLog();
		const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
		ClipControlApi		  cc(m_context, m_api);

		//Enable GL_CULL_FACE, leave default front face & cull face(CCW, BACK)
		gl.enable(GL_CULL_FACE);

		//Render a counter-clockwise triangles covering
		//(-1.0, -1.0) to(0.0, 1.0) and write a pixel value of green(0, 1, 0).
		//Render a clockwise triangles covering
		//(0.0, -1.0) to(1.0, 1.0) and write a pixel value of green(0, 1, 0).
		de::SharedPtr<glu::ShaderProgram> program(
			new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vsh(), fsh())));

		log << (*program);
		if (!program->isOk())
		{
			TCU_FAIL("Program compilation failed");
		}

		gl.genVertexArrays(1, &m_vao);
		gl.bindVertexArray(m_vao);

		gl.genBuffers(1, &m_vbo);

		const float vertex_data0[] = {
			//CCW
			-1.0, -1.0, 0.0, -1.0, -1.0, 1.0, 0.0, -1.0, 0.0, 1.0, -1.0, 1.0,
			//CW
			0.0, -1.0, 0.0, 1.0, 1.0, -1.0, 1.0, -1.0, 0.0, 1.0, 1.0, 1.0,
		};

		gl.bindBuffer(GL_ARRAY_BUFFER, m_vbo);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(vertex_data0), vertex_data0, GL_STATIC_DRAW);

		gl.vertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, 0);
		gl.enableVertexAttribArray(0);

		gl.useProgram(program->getProgram());

		glw::GLenum origins[] = { GL_UPPER_LEFT, GL_LOWER_LEFT };

		qpTestResult result = QP_TEST_RESULT_PASS;

		for (size_t orig = 0; orig < DE_LENGTH_OF_ARRAY(origins); orig++)
		{
			//Clear the framebuffer to red (1,0,0).
			gl.clearColor(1.0, 0.0, 0.0, 1.0);
			gl.clear(GL_COLOR_BUFFER_BIT);

			gl.drawArrays(GL_TRIANGLES, 0, 12);

			//Set ClipControl(<origin>, NEGATIVE_ONE_TO_ONE)
			cc.clipControl(origins[orig], GL_NEGATIVE_ONE_TO_ONE);
			GLU_EXPECT_NO_ERROR(gl.getError(), "ClipControl()");

			//Read back the framebuffer with ReadPixels
			//Verify the green pixels at the left and red at the right.
			qpTestResult loopResult = ValidateFramebuffer(m_context);
			if (loopResult != QP_TEST_RESULT_PASS)
			{
				result = loopResult;
			}
		}
		m_testCtx.setTestResult(result, qpGetTestResultName(result));

		return STOP;
	}